

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::anon_unknown_0::
CommandLineInterfaceTest_CwdRelativeInputNotFoundAndNotMappedError_Test::TestBody
          (CommandLineInterfaceTest_CwdRelativeInputNotFoundAndNotMappedError_Test *this)

{
  string_view name;
  string_view expected_text;
  allocator<char> local_31;
  string local_30;
  
  name._M_str = "bar/dummy";
  name._M_len = 9;
  CommandLineInterfaceTester::CreateTempFile
            ((CommandLineInterfaceTester *)this,name,(string_view)(ZEXT816(0xddc831) << 0x40));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,
             "protocol_compiler --test_out=$tmpdir --proto_path=$tmpdir/bar $tmpdir/foo.proto",
             &local_31);
  CommandLineInterfaceTest::Run(&this->super_CommandLineInterfaceTest,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  expected_text._M_str =
       "Could not make proto path relative: $tmpdir/foo.proto: No such file or directory\n";
  expected_text._M_len = 0x51;
  CommandLineInterfaceTester::ExpectErrorText((CommandLineInterfaceTester *)this,expected_text);
  return;
}

Assistant:

TEST_F(CommandLineInterfaceTest, CwdRelativeInputNotFoundAndNotMappedError) {
  // Check what happens if the input file is not found *and* is not mapped
  // in the proto_path.

  // Create a directory called "bar" so that we can point --proto_path at it.
  CreateTempFile("bar/dummy", "");

  Run("protocol_compiler --test_out=$tmpdir "
      "--proto_path=$tmpdir/bar $tmpdir/foo.proto");

  ExpectErrorText(
      "Could not make proto path relative: $tmpdir/foo.proto: No such file or "
      "directory\n");
}